

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cc
# Opt level: O3

leveldb_t * leveldb_open(leveldb_options_t *options,char *name,char **errptr)

{
  bool bVar1;
  leveldb_t *plVar2;
  DB *db;
  allocator local_49;
  DB local_48;
  leveldb_t local_40;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,name,&local_49);
  leveldb::DB::Open(&local_48,&options->rep,&local_38,&local_40.rep);
  bVar1 = SaveError(errptr,(Status *)&local_48);
  if (local_48._vptr_DB != (_func_int **)0x0) {
    operator_delete__(local_48._vptr_DB);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if (bVar1) {
    plVar2 = (leveldb_t *)0x0;
  }
  else {
    plVar2 = (leveldb_t *)operator_new(8);
    plVar2->rep = local_40.rep;
  }
  return plVar2;
}

Assistant:

leveldb_t* leveldb_open(const leveldb_options_t* options, const char* name,
                        char** errptr) {
  DB* db;
  if (SaveError(errptr, DB::Open(options->rep, std::string(name), &db))) {
    return nullptr;
  }
  leveldb_t* result = new leveldb_t;
  result->rep = db;
  return result;
}